

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_profile_start(lua_State *L)

{
  uint uVar1;
  GCstr *pGVar2;
  GCfunc *pGVar3;
  lua_State *data;
  TValue *pTVar4;
  ulong uVar5;
  GCstr *mode;
  GCobj *o;
  GCtab *t;
  TValue key;
  
  uVar1 = *(uint *)((ulong)(L->glref).ptr32 + 0x118);
  t = (GCtab *)(ulong)uVar1;
  pGVar2 = lj_lib_optstr(L,1);
  pGVar3 = lj_lib_checkfunc(L,2);
  data = lua_newthread(L);
  key.n = -5.73116149175846e-322;
  pTVar4 = lj_tab_set(L,t,&key);
  (pTVar4->u32).lo = (uint32_t)data;
  (pTVar4->field_2).it = 0xfffffff9;
  key.n = -5.03946958758071e-322;
  pTVar4 = lj_tab_set(L,t,&key);
  (pTVar4->u32).lo = (uint32_t)pGVar3;
  (pTVar4->field_2).it = 0xfffffff7;
  if ((t->marked & 4) != 0) {
    uVar5 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x6c);
    *(uint *)(uVar5 + 0x6c) = uVar1;
  }
  mode = (GCstr *)0x1594f9;
  if (pGVar2 != (GCstr *)0x0) {
    mode = pGVar2 + 1;
  }
  luaJIT_profile_start(L,(char *)mode,jit_profile_callback,data);
  return 0;
}

Assistant:

LJLIB_CF(jit_profile_start)
{
  GCtab *registry = tabV(registry(L));
  GCstr *mode = lj_lib_optstr(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  lua_State *L2 = lua_newthread(L);  /* Thread that runs profiler callback. */
  TValue key;
  /* Anchor thread and function in registry. */
  key.u64 = KEY_PROFILE_THREAD;
  setthreadV(L, lj_tab_set(L, registry, &key), L2);
  key.u64 = KEY_PROFILE_FUNC;
  setfuncV(L, lj_tab_set(L, registry, &key), func);
  lj_gc_anybarriert(L, registry);
  luaJIT_profile_start(L, mode ? strdata(mode) : "",
		       (luaJIT_profile_callback)jit_profile_callback, L2);
  return 0;
}